

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

int __thiscall PeleLM::derive(PeleLM *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  bool bVar1;
  int iVar2;
  FabFactory<amrex::FArrayBox> *factory;
  BoxArray *bxs;
  type pMVar3;
  EVP_PKEY_CTX *dm;
  undefined4 in_XMM0_Da;
  string msg;
  int dcomp;
  DeriveRec *rec;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *mf;
  pointer in_stack_fffffffffffffec8;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffee0;
  DeriveList *in_stack_fffffffffffffee8;
  MFInfo *in_stack_fffffffffffffef0;
  uint uVar4;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [16];
  undefined1 local_80 [83];
  undefined1 local_2d;
  uint local_2c;
  undefined4 local_28;
  string *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  PeleLM *local_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8;
  
  local_2c = (uint)keylen;
  local_2d = 0;
  local_20 = (string *)key;
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ctx;
  local_10 = this;
  local_28 = in_XMM0_Da;
  std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
  unique_ptr<std::default_delete<amrex::MultiFab>,void>(in_stack_fffffffffffffed0);
  local_80._72_8_ = amrex::DeriveList::get(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  if ((DeriveRec *)local_80._72_8_ == (DeriveRec *)0x0) {
    amrex::AmrLevel::derive((AmrLevel *)local_90,ctx,(uchar *)local_20,(size_t *)(ulong)local_2c);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              (in_stack_fffffffffffffed0,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffec8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              (in_stack_fffffffffffffed0);
  }
  else {
    factory = (FabFactory<amrex::FArrayBox> *)operator_new(0x180);
    local_90[0xf] = 1;
    dm = ctx + 0xd8;
    bxs = (BoxArray *)(ctx + 0x140);
    iVar2 = amrex::DeriveRec::numDerive((DeriveRec *)local_80._72_8_);
    local_80._24_8_ = 0;
    local_80._32_8_ = 0;
    local_80._8_8_ = 0.0;
    local_80._16_8_ = 0;
    local_80._40_8_ = 0;
    uVar4 = local_2c;
    amrex::MFInfo::MFInfo((MFInfo *)0x530f12);
    local_80._0_8_ = (_func_int **)0x0;
    in_stack_fffffffffffffec8 = (pointer)local_80;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffed0);
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(uVar4,iVar2),bxs,(DistributionMapping *)dm,
               (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8,
               in_stack_fffffffffffffef0,factory);
    local_90[0xf] = 0;
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x530f83);
    amrex::MFInfo::~MFInfo((MFInfo *)0x530f90);
    local_90._8_4_ = 0;
    in_stack_fffffffffffffee0 = local_20;
    pMVar3 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                       (in_stack_fffffffffffffed0);
    (**(code **)(*(long *)ctx + 0x100))
              (local_28,ctx,in_stack_fffffffffffffee0,pMVar3,local_90._8_4_);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"PeleLM::derive(): unknown variable: ",&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::operator+=(local_b0,(string *)local_20);
    local_8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__cxx11::string::c_str();
    amrex::Error_host((char *)in_stack_fffffffffffffee0);
    std::__cxx11::string::~string(local_b0);
  }
  return (int)this;
}

Assistant:

std::unique_ptr<MultiFab>
PeleLM::derive (const std::string& name,
                Real               time,
                int                ngrow)
{
  AMREX_ASSERT(ngrow >= 0);

  std::unique_ptr<MultiFab> mf;
  const DeriveRec* rec = derive_lst.get(name);
  if (rec)
  {
    mf.reset(new MultiFab(grids, dmap, rec->numDerive(), ngrow));
    int dcomp = 0;
    derive(name,time,*mf,dcomp);
  }
  else
  {
    mf = std::move(AmrLevel::derive(name,time,ngrow));
  }

  if (mf==nullptr) {
    std::string msg("PeleLM::derive(): unknown variable: ");
    msg += name;
    amrex::Error(msg.c_str());
  }
  return mf;
}